

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cc
# Opt level: O0

bool __thiscall anon_unknown.dwarf_4fc19::Scanner::command_has_arg(Scanner *this,TSLexer *lexer)

{
  bool bVar1;
  bool local_32;
  bool local_29;
  TSLexer *lexer_local;
  Scanner *this_local;
  
  while( true ) {
    local_29 = false;
    if (lexer->lookahead != 0) {
      local_29 = is_inline_space(this,lexer->lookahead);
    }
    if (local_29 == false) break;
    (*lexer->advance)(lexer,true);
  }
  if (lexer->lookahead != 10) {
    if (lexer->lookahead != 0x25) {
      return lexer->lookahead == 0x7b;
    }
    while( true ) {
      bVar1 = false;
      if (lexer->lookahead != 0) {
        bVar1 = lexer->lookahead != 10;
      }
      if (!bVar1) break;
      (*lexer->advance)(lexer,true);
    }
  }
  while( true ) {
    if (lexer->lookahead == 0) {
      return true;
    }
    (*lexer->advance)(lexer,true);
    while( true ) {
      local_32 = false;
      if (lexer->lookahead != 0) {
        local_32 = is_inline_space(this,lexer->lookahead);
      }
      if (local_32 == false) break;
      (*lexer->advance)(lexer,true);
    }
    if (lexer->lookahead != 0x25) break;
    while( true ) {
      bVar1 = false;
      if (lexer->lookahead != 0) {
        bVar1 = lexer->lookahead != 10;
      }
      if (!bVar1) break;
      (*lexer->advance)(lexer,true);
    }
  }
  return lexer->lookahead == 0x7b;
}

Assistant:

bool command_has_arg (TSLexer *lexer) {
    while (lexer->lookahead && is_inline_space(lexer->lookahead)) {
      lexer->advance(lexer, true);
    }

    switch (lexer->lookahead) {
      case '\n':
        break;
      case '%':
        while (lexer->lookahead && lexer->lookahead != '\n') {
          lexer->advance(lexer, true);
        }
        break;
      default:
        return lexer->lookahead == '{';
    }

    while (lexer->lookahead) {
      lexer->advance(lexer, true);

      while (lexer->lookahead && is_inline_space(lexer->lookahead)) {
        lexer->advance(lexer, true);
      }

      if (lexer->lookahead != '%') {
        return lexer->lookahead == '{';
      }

      while (lexer->lookahead && lexer->lookahead != '\n') {
        lexer->advance(lexer, true);
      }
    }

    return true;
  }